

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::checkOwnership(QPDFObjectHandle *this,QPDFObjectHandle *item)

{
  QPDF *pQVar1;
  QPDF *pQVar2;
  logic_error *this_00;
  
  pQVar1 = getOwningQPDF(this);
  pQVar2 = getOwningQPDF(item);
  if (((pQVar1 != pQVar2) && (pQVar1 != (QPDF *)0x0)) && (pQVar2 != (QPDF *)0x0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Attempting to add an object from a different QPDF. Use QPDF::copyForeignObject to add objects from another file."
              );
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::checkOwnership(QPDFObjectHandle const& item) const
{
    auto qpdf = getOwningQPDF();
    auto item_qpdf = item.getOwningQPDF();
    if (qpdf && item_qpdf && qpdf != item_qpdf) {
        QTC::TC("qpdf", "QPDFObjectHandle check ownership");
        throw std::logic_error(
            "Attempting to add an object from a different QPDF. Use "
            "QPDF::copyForeignObject to add objects from another file.");
    }
}